

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O2

void tcu::astc::anon_unknown_0::generateRandomBlock(deUint8 *dst,IVec3 *blockSize,Random *rnd)

{
  int numPartitions;
  bool bVar1;
  bool bVar2;
  deFloat16 dVar3;
  deUint32 dVar4;
  int iVar5;
  uint uVar6;
  deUint32 dVar7;
  uint uVar8;
  uint uVar9;
  ISEParams IVar10;
  NormalBlockISEInputs *pNVar11;
  anon_union_1536_2_f6fb8abe_for_value *paVar12;
  anon_union_1536_2_f6fb8abe_for_value *extraout_RDX;
  anon_union_1536_2_f6fb8abe_for_value *extraout_RDX_00;
  anon_union_1536_2_f6fb8abe_for_value *extraout_RDX_01;
  int i;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  NormalBlockISEInputs *pNVar16;
  undefined1 *puVar17;
  ISEMode IVar18;
  float fVar19;
  NormalBlockParams local_c8c;
  ISEParams local_c58;
  anon_union_1536_2_f6fb8abe_for_value *local_c50;
  undefined1 local_c48 [16];
  NormalBlockISEInputs iseInputs;
  
  fVar19 = deRandom_getFloat(&rnd->m_rnd);
  if (0.1 <= fVar19) {
    local_c8c.isDualPlane = true;
    local_c8c.ccs = 0xffffffff;
    local_c8c.partitionSeed = 0xffffffff;
    local_c8c.colorEndpointModes[0] = 0;
    local_c8c.colorEndpointModes[1] = 0;
    local_c8c.colorEndpointModes[2] = 0;
    local_c8c.colorEndpointModes[3] = 0;
    iVar14 = blockSize->m_data[0];
    do {
      local_c8c.weightGridWidth = de::Random::getInt(rnd,2,iVar14);
      local_c8c.weightGridHeight = de::Random::getInt(rnd,2,blockSize->m_data[1]);
      dVar7 = deRandom_getUint32(&rnd->m_rnd);
      uVar6 = 0;
      local_c8c.weightISEParams =
           *(ISEParams *)
            (&astc::(anonymous_namespace)::s_weightISEParamsCandidates + (ulong)dVar7 % 0xc);
      dVar7 = deRandom_getUint32(&rnd->m_rnd);
      iVar14 = (dVar7 & 3) + 1;
      local_c8c.numPartitions = iVar14;
      fVar19 = deRandom_getFloat(&rnd->m_rnd);
      local_c8c.isMultiPartSingleCemMode = fVar19 < 0.25;
      bVar1 = false;
      if (iVar14 != 4) {
        bVar1 = de::Random::getBool(rnd);
      }
      local_c8c.isDualPlane = bVar1;
      dVar4 = deRandom_getUint32(&rnd->m_rnd);
      local_c8c.ccs = dVar4 & 3;
      dVar4 = deRandom_getUint32(&rnd->m_rnd);
      local_c8c.partitionSeed = dVar4 & 0x3ff;
      dVar4 = deRandom_getUint32(&rnd->m_rnd);
      uVar8 = dVar4 & 0xf;
      local_c8c.colorEndpointModes._0_8_ =
           CONCAT44(local_c8c.colorEndpointModes[1],dVar4) & 0xffffffff0000000f;
      if (0.25 <= fVar19) {
        uVar6 = 1;
        if (uVar8 != 0) {
          if (uVar8 == 0xf) {
            uVar6 = 0xffffffff;
          }
          else {
            bVar1 = de::Random::getBool(rnd);
            uVar6 = bVar1 - 1 | 1;
          }
        }
      }
      for (uVar15 = 0; (dVar7 & 3) != uVar15; uVar15 = uVar15 + 1) {
        if (uVar6 == 1) {
          dVar4 = deRandom_getUint32(&rnd->m_rnd);
          uVar9 = dVar4 & 1;
        }
        else {
          uVar9 = 0;
          if (uVar6 == 0xffffffff) {
            dVar4 = deRandom_getUint32(&rnd->m_rnd);
            uVar9 = (dVar4 & 1) - 1;
          }
        }
        local_c8c.colorEndpointModes[uVar15 + 1] = uVar9 + uVar8;
      }
      iVar14 = blockSize->m_data[0];
      bVar2 = isValidBlockParams(&local_c8c,iVar14,blockSize->m_data[1]);
      bVar1 = local_c8c.isMultiPartSingleCemMode;
      numPartitions = local_c8c.numPartitions;
    } while (!bVar2);
    iseInputs.weight._0_8_ = iseInputs.weight._0_8_ & 0xffffffffffffff00;
    iseInputs.endpoint.isGivenInBlockForm = false;
    pNVar11 = (NormalBlockISEInputs *)
              (ulong)CONCAT31((int3)((uint)local_c8c.numPartitions >> 8),local_c8c.isDualPlane);
    uVar6 = local_c8c.weightGridHeight * local_c8c.weightGridWidth <<
            (local_c8c.isDualPlane & 0x1fU);
    paVar12 = (anon_union_1536_2_f6fb8abe_for_value *)(ulong)uVar6;
    local_c58 = local_c8c.weightISEParams;
    iVar14 = 0;
    do {
      if (iVar14 == 0) {
        pNVar16 = &iseInputs;
        IVar10 = local_c58;
        uVar8 = uVar6;
      }
      else {
        if (iVar14 == 2) goto LAB_01620d65;
        uVar8 = computeNumColorEndpointValues
                          (local_c8c.colorEndpointModes,numPartitions,(bool)(bVar1 & 1));
        iVar5 = computeNumBitsForColorEndpoints(&local_c8c);
        IVar10 = computeMaximumRangeISEParams(iVar5,uVar8);
        pNVar16 = (NormalBlockISEInputs *)&iseInputs.endpoint;
      }
      uVar15 = (ulong)uVar8;
      local_c48._0_4_ = IVar10.mode;
      local_c48._4_4_ = IVar10.numBits;
      bVar2 = de::Random::getBool(rnd);
      (pNVar16->weight).isGivenInBlockForm = bVar2;
      if (bVar2) {
        IVar18 = IVar10.mode;
        uVar15 = (ulong)((IVar18 == ISEMODE_QUINT) + 1 + (uint)(IVar18 == ISEMODE_QUINT));
        if (IVar18 == ISEMODE_TRIT) {
          uVar15 = 5;
        }
        uVar13 = (long)(int)uVar8 % (long)(int)uVar15;
        paVar12 = (anon_union_1536_2_f6fb8abe_for_value *)(uVar13 & 0xffffffff);
        uVar8 = ((int)uVar8 / (int)uVar15 + 1) - (uint)((int)uVar13 == 0);
        local_c50 = &(pNVar16->weight).value;
        if ((int)uVar8 < 1) {
          uVar8 = 0;
        }
        puVar17 = (undefined1 *)((long)&(pNVar16->weight).value + 4);
        pNVar11 = (NormalBlockISEInputs *)(ulong)uVar8;
        for (pNVar16 = (NormalBlockISEInputs *)0x0; pNVar16 != (NormalBlockISEInputs *)(ulong)uVar8;
            pNVar16 = (NormalBlockISEInputs *)&(pNVar16->weight).field_0x1) {
          dVar7 = deRandom_getUint32(&rnd->m_rnd);
          pNVar11 = (NormalBlockISEInputs *)((long)pNVar16 * 0x18);
          local_c50->block[(long)pNVar16].tOrQValue = dVar7 & 0xff;
          paVar12 = local_c50;
          for (uVar13 = 0; uVar15 != uVar13; uVar13 = uVar13 + 1) {
            iVar5 = de::Random::getInt(rnd,0,~(-1 << ((byte)IVar10.numBits & 0x1f)));
            *(int *)(puVar17 + uVar13 * 4) = iVar5;
            paVar12 = extraout_RDX;
          }
          puVar17 = puVar17 + 0x18;
        }
      }
      else {
        dVar7 = computeISERangeMax((ISEParams *)local_c48);
        if ((int)uVar8 < 1) {
          uVar15 = 0;
        }
        paVar12 = extraout_RDX_00;
        for (uVar13 = 0; uVar15 != uVar13; uVar13 = uVar13 + 1) {
          iVar5 = de::Random::getInt(rnd,0,dVar7);
          *(int *)((long)&(pNVar16->weight).value + uVar13 * 4) = iVar5;
          paVar12 = extraout_RDX_01;
        }
      }
      iVar14 = iVar14 + 1;
    } while( true );
  }
  bVar1 = de::Random::getBool(rnd);
  if (bVar1) {
    fVar19 = deRandom_getFloat(&rnd->m_rnd);
    dVar3 = deFloat32To16(fVar19 + 0.0);
    uVar6 = (uint)dVar3;
    fVar19 = deRandom_getFloat(&rnd->m_rnd);
    dVar3 = deFloat32To16(fVar19 + 0.0);
    dVar7 = (deUint32)dVar3;
    fVar19 = deRandom_getFloat(&rnd->m_rnd);
    dVar3 = deFloat32To16(fVar19 + 0.0);
    uVar8 = (uint)dVar3;
    fVar19 = deRandom_getFloat(&rnd->m_rnd);
    dVar3 = deFloat32To16(fVar19 + 0.0);
    uVar9 = (uint)dVar3;
    iseInputs.weight._0_8_ = 0xfffffffffffffffc;
  }
  else {
    uVar6 = deRandom_getUint32(&rnd->m_rnd);
    dVar7 = deRandom_getUint32(&rnd->m_rnd);
    uVar8 = deRandom_getUint32(&rnd->m_rnd);
    uVar9 = deRandom_getUint32(&rnd->m_rnd);
    iseInputs.weight._0_8_ = 0xfffffffffffffdfc;
  }
  iseInputs.weight.value._4_8_ =
       (ulong)(uVar9 & 0xffff) << 0x30 |
       CONCAT44(uVar8,dVar7 << 0x10 | uVar6 & 0xffff) & 0xffffffffffff;
  pNVar11 = &iseInputs;
LAB_01620ddd:
  AssignBlock128::assignToMemory((AssignBlock128 *)pNVar11,dst);
  return;
LAB_01620d65:
  local_c48 = (undefined1  [16])generateNormalBlock(&local_c8c,(int)&iseInputs,(int)paVar12,pNVar11)
  ;
  pNVar11 = (NormalBlockISEInputs *)local_c48;
  goto LAB_01620ddd;
}

Assistant:

void generateRandomBlock (deUint8* dst, const IVec3& blockSize, de::Random& rnd)
{
	DE_ASSERT(blockSize.z() == 1);

	if (rnd.getFloat() < 0.1f)
	{
		// Void extent block.
		const bool		isVoidExtentHDR		= rnd.getBool();
		const deUint16	r					= isVoidExtentHDR ? deFloat32To16(rnd.getFloat(0.0f, 1.0f)) : (deUint16)rnd.getInt(0, 0xffff);
		const deUint16	g					= isVoidExtentHDR ? deFloat32To16(rnd.getFloat(0.0f, 1.0f)) : (deUint16)rnd.getInt(0, 0xffff);
		const deUint16	b					= isVoidExtentHDR ? deFloat32To16(rnd.getFloat(0.0f, 1.0f)) : (deUint16)rnd.getInt(0, 0xffff);
		const deUint16	a					= isVoidExtentHDR ? deFloat32To16(rnd.getFloat(0.0f, 1.0f)) : (deUint16)rnd.getInt(0, 0xffff);
		generateVoidExtentBlock(VoidExtentParams(isVoidExtentHDR, r, g, b, a)).assignToMemory(dst);
	}
	else
	{
		// Not void extent block.

		// Generate block params.

		NormalBlockParams blockParams;

		do
		{
			blockParams.weightGridWidth				= rnd.getInt(2, blockSize.x());
			blockParams.weightGridHeight			= rnd.getInt(2, blockSize.y());
			blockParams.weightISEParams				= s_weightISEParamsCandidates[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_weightISEParamsCandidates)-1)];
			blockParams.numPartitions				= rnd.getInt(1, 4);
			blockParams.isMultiPartSingleCemMode	= rnd.getFloat() < 0.25f;
			blockParams.isDualPlane					= blockParams.numPartitions != 4 && rnd.getBool();
			blockParams.ccs							= rnd.getInt(0, 3);
			blockParams.partitionSeed				= rnd.getInt(0, 1023);

			blockParams.colorEndpointModes[0] = rnd.getInt(0, 15);

			{
				const int cemDiff = blockParams.isMultiPartSingleCemMode		? 0
									: blockParams.colorEndpointModes[0] == 0	? 1
									: blockParams.colorEndpointModes[0] == 15	? -1
									: rnd.getBool()								? 1 : -1;

				for (int i = 1; i < blockParams.numPartitions; i++)
					blockParams.colorEndpointModes[i] = blockParams.colorEndpointModes[0] + (cemDiff == -1 ? rnd.getInt(-1, 0) : cemDiff == 1 ? rnd.getInt(0, 1) : 0);
			}
		} while (!isValidBlockParams(blockParams, blockSize.x(), blockSize.y()));

		// Generate ISE inputs for both weight and endpoint data.

		NormalBlockISEInputs iseInputs;

		for (int weightOrEndpoints = 0; weightOrEndpoints <= 1; weightOrEndpoints++)
		{
			const bool			setWeights	= weightOrEndpoints == 0;
			const int			numValues	= setWeights ? computeNumWeights(blockParams) :
												computeNumColorEndpointValues(&blockParams.colorEndpointModes[0], blockParams.numPartitions, blockParams.isMultiPartSingleCemMode);
			const ISEParams		iseParams	= setWeights ? blockParams.weightISEParams : computeMaximumRangeISEParams(computeNumBitsForColorEndpoints(blockParams), numValues);
			ISEInput&			iseInput	= setWeights ? iseInputs.weight : iseInputs.endpoint;

			iseInput.isGivenInBlockForm = rnd.getBool();

			if (iseInput.isGivenInBlockForm)
			{
				const int numValuesPerISEBlock	= iseParams.mode == ISEMODE_TRIT	? 5
												: iseParams.mode == ISEMODE_QUINT	? 3
												:									  1;
				const int iseBitMax				= (1 << iseParams.numBits) - 1;
				const int numISEBlocks			= deDivRoundUp32(numValues, numValuesPerISEBlock);

				for (int iseBlockNdx = 0; iseBlockNdx < numISEBlocks; iseBlockNdx++)
				{
					iseInput.value.block[iseBlockNdx].tOrQValue = rnd.getInt(0, 255);
					for (int i = 0; i < numValuesPerISEBlock; i++)
						iseInput.value.block[iseBlockNdx].bitValues[i] = rnd.getInt(0, iseBitMax);
				}
			}
			else
			{
				const int rangeMax = computeISERangeMax(iseParams);

				for (int valueNdx = 0; valueNdx < numValues; valueNdx++)
					iseInput.value.plain[valueNdx] = rnd.getInt(0, rangeMax);
			}
		}

		generateNormalBlock(blockParams, blockSize.x(), blockSize.y(), iseInputs).assignToMemory(dst);
	}
}